

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O3

int __thiscall
BaseModel::collectChessboardCorners
          (BaseModel *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list,Size *board_size,Size *square_size,Size *image_size,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list_detected,bool show_result)

{
  pointer pbVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  int local_18c;
  int base_line;
  string msg;
  int local_160;
  undefined4 local_15c;
  undefined8 *local_158;
  Mat *local_150;
  undefined8 local_148 [2];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  Size text_size;
  _InputArray local_e8;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Mat image;
  
  createChessboardCorners(&object_points,this,board_size,square_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(image_list_detected);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::clear(object_points_list);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::clear(image_points_list);
  if ((image_list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (image_list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_18c = 0;
  }
  else {
    lVar8 = 0;
    local_18c = 0;
    uVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Load image: ",0xc);
      pbVar1 = (image_list->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar8),
                 *(long *)((long)&pbVar1->_M_string_length + lVar8));
      cv::imread((string *)&image,
                 (int)(image_list->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (int)lVar8);
      cVar2 = cv::Mat::empty();
      if (cVar2 != '\0') {
        std::operator+(&msg,"Invalid image path: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(((image_list->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar8));
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,msg._M_dataplus._M_p,msg._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p);
        }
        cv::Mat::~Mat(&image);
        break;
      }
      iVar5 = image_size->height;
      if (image_size->width == 0 && iVar5 == 0) {
        image_size->width = image.cols;
        image_size->height = image.rows;
        iVar5 = image.rows;
      }
      else if (image_size->width != image.cols) goto LAB_0010d237;
      if (iVar5 != image.rows) {
LAB_0010d237:
        __assert_fail("image_size.width == image.cols and image_size.height == image.rows",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sleepbysleep[P]extensive_calibrate/base_model.hpp"
                      ,0x19a,
                      "int BaseModel::collectChessboardCorners(const std::vector<std::string> &, const cv::Size &, const cv::Size &, cv::Size &, std::vector<std::vector<cv::Point3f>> &, std::vector<std::vector<cv::Point2f>> &, std::vector<std::string> &, bool)"
                     );
      }
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = detectChessboardCorners(this,&image,board_size,&image_points,show_result);
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(image_list_detected,
                    (value_type *)
                    ((long)&(((image_list->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8
                    ));
        std::
        vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
        ::push_back(object_points_list,&object_points);
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::push_back(image_points_list,&image_points);
        local_18c = local_18c + 1;
      }
      cv::format_abi_cxx11_
                ((char *)&msg,"%d/%d",(ulong)((int)uVar9 + 1),
                 (ulong)((long)(image_list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(image_list->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
      pcVar7 = " Detecting crosses of chessboard failed! - ";
      if (bVar3) {
        pcVar7 = " Detecting crosses of chessboard complete - ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar7,(ulong)bVar3 + 0x2b);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,msg._M_dataplus._M_p,msg._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if (show_result) {
        cv::getTextSize((string *)&text_size,(int)&msg,1.0,1,(int *)0x1);
        local_148[0] = 0;
        local_158 = (undefined8 *)CONCAT44(local_158._4_4_,0x3010000);
        local_160 = text_size.width + 10;
        local_15c = 10;
        local_b8 = 0;
        uStack_b0 = 0;
        local_a8 = 0x406fe00000000000;
        uStack_a0 = 0;
        local_150 = &image;
        cv::putText(0,(string *)&local_158,&msg,&local_160,1,&local_b8,1,8,0);
        local_158 = local_148;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Image","");
        local_e8.sz.width = 0;
        local_e8.sz.height = 0;
        local_e8.flags = 0x1010000;
        local_e8.obj = &image;
        cv::imshow((string *)&local_158,&local_e8);
        if (local_158 != local_148) {
          operator_delete(local_158);
        }
        bVar4 = cv::waitKey(500);
        if ((bVar4 == 0x1b) || ((bVar4 & 0xdf) == 0x51)) {
          exit(-1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p);
      }
      if (image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(image_points.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      cv::Mat::~Mat(&image);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)((long)(image_list->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(image_list->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(object_points.
                    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return local_18c;
}

Assistant:

int collectChessboardCorners(
    const std::vector<std::string>& image_list,
    const cv::Size& board_size,
    const cv::Size& square_size,
    cv::Size& image_size,
    std::vector<std::vector<cv::Point3f>>& object_points_list,
    std::vector<std::vector<cv::Point2f>>& image_points_list,
    std::vector<std::string>& image_list_detected,
    bool show_result=true
  ) {
    std::vector<cv::Point3f> object_points = this->createChessboardCorners(board_size, square_size);

    int count = 0;
    image_list_detected.clear();
    object_points_list.clear();
    image_points_list.clear();
    for (size_t i = 0; i < image_list.size(); ++i) {
      if (DEBUG) std::cout << "Load image: " << image_list[i];
    
      cv::Mat image = cv::imread(image_list[i], cv::IMREAD_COLOR);
      if (image.empty()) {
	std::cerr << "Invalid image path: " + image_list[i] << std::endl;
	break;
      }

      if (image_size == cv::Size(0,0)) {
	image_size.width = image.cols;
	image_size.height = image.rows;
      }
      assert(image_size.width == image.cols and image_size.height == image.rows);
      
      std::vector<cv::Point2f> image_points;
      bool found = this->detectChessboardCorners(
	image,
	board_size,
	image_points,
	show_result
      );
      
      if (found) {
	image_list_detected.push_back(image_list[i]);
	object_points_list.push_back(object_points);
	image_points_list.push_back(image_points);
	++count;
      }

      std::string msg = cv::format("%d/%d", (int)(i+1), (int)image_list.size());
      if (DEBUG) {
	if (found) {
	  std::cout << " Detecting crosses of chessboard complete - " << msg << "\n";
	} else {
	  std::cout << " Detecting crosses of chessboard failed! - " << msg << "\n";
	}
      }

      if (show_result) {
	//cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);

	int base_line = 0;
	cv::Size text_size = cv::getTextSize(msg, 1, 1, 1, &base_line);

	cv::putText(image, msg,
		    cv::Point(10 + text_size.width, 10 + 2 * base_line),
		    1, 1, cv::Scalar(0,0,255));
	cv::imshow("Image", image);
	char key = (char)cv::waitKey(500);
	if (key == 27 || key == 'q' || key == 'Q') {
	  exit(-1);
	}
      }
    }
    return count;
  }